

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O2

iterator * __thiscall
QPDFNameTreeObjectHelper::find
          (iterator *__return_storage_ptr__,QPDFNameTreeObjectHelper *this,string *key,
          bool return_prev_if_not_found)

{
  NNTreeImpl *this_00;
  iterator i;
  undefined1 local_a0 [128];
  
  this_00 = (((this->m).
              super___shared_ptr<QPDFNameTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->impl).super___shared_ptr<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  QPDFObjectHandle::newUnicodeString((QPDFObjectHandle *)(local_a0 + 0x10),key);
  NNTreeImpl::find((iterator *)(local_a0 + 0x20),this_00,(QPDFObjectHandle *)(local_a0 + 0x10),
                   return_prev_if_not_found);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 0x18));
  std::make_shared<NNTreeIterator,NNTreeIterator&>((NNTreeIterator *)local_a0);
  iterator::iterator(__return_storage_ptr__,(shared_ptr<NNTreeIterator> *)local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
  NNTreeIterator::~NNTreeIterator((NNTreeIterator *)(local_a0 + 0x20));
  return __return_storage_ptr__;
}

Assistant:

QPDFNameTreeObjectHelper::iterator
QPDFNameTreeObjectHelper::find(std::string const& key, bool return_prev_if_not_found)
{
    auto i = m->impl->find(QPDFObjectHandle::newUnicodeString(key), return_prev_if_not_found);
    return {std::make_shared<NNTreeIterator>(i)};
}